

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813_9.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementHexaANCF_3813_9::CalcCoordDerivMatrix
          (ChElementHexaANCF_3813_9 *this,ChVectorN<double,_33> *dt)

{
  pointer psVar1;
  long lVar2;
  element_type *peVar3;
  double *pdVar4;
  long lVar5;
  
  psVar1 = (this->m_nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pdVar4 = (dt->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.
           array + 2;
  lVar5 = 0;
  do {
    lVar2 = *(long *)((long)&(psVar1->
                             super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr + lVar5);
    lVar5 = lVar5 + 0x10;
    ((plain_array<double,_33,_0,_0> *)(pdVar4 + -2))->array[0] = *(double *)(lVar2 + 0x38);
    pdVar4[-1] = *(double *)(lVar2 + 0x40);
    *pdVar4 = *(double *)(lVar2 + 0x48);
    pdVar4 = pdVar4 + 3;
  } while (lVar5 != 0x80);
  peVar3 = (this->m_central_node).
           super___shared_ptr<chrono::fea::ChNodeFEAcurv,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (dt->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array[0x18]
       = (peVar3->m_rxx_dt).m_data[0];
  (dt->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array[0x19]
       = (peVar3->m_rxx_dt).m_data[1];
  (dt->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array[0x1a]
       = (peVar3->m_rxx_dt).m_data[2];
  (dt->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array[0x1b]
       = (peVar3->m_ryy_dt).m_data[0];
  (dt->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array[0x1c]
       = (peVar3->m_ryy_dt).m_data[1];
  (dt->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array[0x1d]
       = (peVar3->m_ryy_dt).m_data[2];
  (dt->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array[0x1e]
       = (peVar3->m_rzz_dt).m_data[0];
  (dt->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array[0x1f]
       = (peVar3->m_rzz_dt).m_data[1];
  (dt->super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>).m_storage.m_data.array[0x20]
       = (peVar3->m_rzz_dt).m_data[2];
  return;
}

Assistant:

void ChElementHexaANCF_3813_9::CalcCoordDerivMatrix(ChVectorN<double, 33>& dt) {
    for (int i = 0; i < 8; i++) {
        const ChVector<>& vel = m_nodes[i]->GetPos_dt();
        dt(3 * i + 0) = vel.x();
        dt(3 * i + 1) = vel.y();
        dt(3 * i + 2) = vel.z();
    }

    dt(24) = m_central_node->GetCurvatureXX_dt().x();
    dt(25) = m_central_node->GetCurvatureXX_dt().y();
    dt(26) = m_central_node->GetCurvatureXX_dt().z();
    dt(27) = m_central_node->GetCurvatureYY_dt().x();
    dt(28) = m_central_node->GetCurvatureYY_dt().y();
    dt(29) = m_central_node->GetCurvatureYY_dt().z();
    dt(30) = m_central_node->GetCurvatureZZ_dt().x();
    dt(31) = m_central_node->GetCurvatureZZ_dt().y();
    dt(32) = m_central_node->GetCurvatureZZ_dt().z();
}